

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correctness.cc
# Opt level: O2

void __thiscall CorrectnessTest::start_test(CorrectnessTest *this,void *args)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"KVStore Correctness Test");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"[Simple Test]");
  std::endl<char,std::char_traits<char>>(poVar1);
  regular_test(this,this->SIMPLE_TEST_MAX);
  poVar1 = std::operator<<((ostream *)&std::cout,"[Large Test]");
  std::endl<char,std::char_traits<char>>(poVar1);
  regular_test(this,this->LARGE_TEST_MAX);
  return;
}

Assistant:

void start_test(void *args = NULL) override {
    std::cout << "KVStore Correctness Test" << std::endl;

    std::cout << "[Simple Test]" << std::endl;
    regular_test(SIMPLE_TEST_MAX);

    std::cout << "[Large Test]" << std::endl;
    regular_test(LARGE_TEST_MAX);
  }